

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

ON_Linetype * Internal_BuiltInLinePattern(ON_Linetype *__return_storage_ptr__,int index)

{
  ON_Linetype *pOVar1;
  int i;
  ON_LinetypeSegment segment;
  ON_SimpleArray<double> segments;
  
  ON_Linetype::ON_Linetype(__return_storage_ptr__);
  ON_SimpleArray<double>::ON_SimpleArray(&segments,8);
  pOVar1 = (ON_Linetype *)
           (*(code *)(&DAT_006c5590 + *(int *)(&DAT_006c5590 + (ulong)(index + 9) * 4)))();
  return pOVar1;
}

Assistant:

static ON_Linetype Internal_BuiltInLinePattern( int index )
{
  ON_Linetype line_pattern;
  ON_SimpleArray<double> segments(8);

  switch (index)
  {
  case -1: // Continuous
    {
      const ON_UUID line_pattern_id =
      { 0x3999bed5, 0x78ee, 0x4d73,{ 0xa0, 0x59, 0x3, 0x22, 0x24, 0xc6, 0xfd, 0x55 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Continuous",
        line_pattern
      );
      line_pattern.AppendSegment(ON_LinetypeSegment::OneMillimeterLine);
    }
    break;

  case -2: // By Layer
    {
      const ON_UUID line_pattern_id =
      { 0x913882da, 0xbce9, 0x4a67,{ 0x8d, 0x86, 0xd4, 0x49, 0xfd, 0x58, 0x50, 0xb8 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"By Layer",
        line_pattern
        );
      line_pattern.AppendSegment(ON_LinetypeSegment::OneMillimeterLine);
    }
    break;

  case -3: // By Parent
    {
      const ON_UUID line_pattern_id =
      { 0xef59d771, 0x5099, 0x4f60,{ 0x99, 0x14, 0xc1, 0x83, 0x6a, 0xeb, 0xe4, 0x84 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"By Parent",
        line_pattern
        );
      line_pattern.AppendSegment(ON_LinetypeSegment::OneMillimeterLine);
    }
    break;

  case -4: // Hidden
    {
      // {7A55AC0F-803C-431B-A7FE-A43319436C8A}
      const ON_UUID line_pattern_id = 
      { 0x7a55ac0f, 0x803c, 0x431b, { 0xa7, 0xfe, 0xa4, 0x33, 0x19, 0x43, 0x6c, 0x8a } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Hidden",
        line_pattern
        );
      segments.Append(2.0);
      segments.Append(-2.0);
    }
    break;

  case -5: // Dashed
    {
      // {864526FB-1EEC-40B9-85E1-4619C1F670C5}
      const ON_UUID line_pattern_id =
      { 0x864526fb, 0x1eec, 0x40b9, { 0x85, 0xe1, 0x46, 0x19, 0xc1, 0xf6, 0x70, 0xc5 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Dashed",
        line_pattern
        );
      segments.Append(5.0);
      segments.Append(-5.0);
    }
    break;

  case -6: // DashDot
    {
      // {249AD50D-96C7-44A7-AB20-136EAE74C34D}
      const ON_UUID line_pattern_id =
      { 0x249ad50d, 0x96c7, 0x44a7, { 0xab, 0x20, 0x13, 0x6e, 0xae, 0x74, 0xc3, 0x4d } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"DashDot",
        line_pattern
        );
      segments.Append(4.0);
      segments.Append(-1.0);
      segments.Append(0.0);
      segments.Append(-1.0);
    }
    break;

  case -7: // Center
    {
      // {B59B1B65-F88F-4854-BED4-E52C51970D0C}
      const ON_UUID line_pattern_id =
      { 0xb59b1b65, 0xf88f, 0x4854, { 0xbe, 0xd4, 0xe5, 0x2c, 0x51, 0x97, 0xd, 0xc } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Center",
        line_pattern
        );
      segments.Append(2.5);
      segments.Append(-0.5);
      segments.Append(0.5);
      segments.Append(-0.5);
    }
    break;

  case -8: // Border
    {
      // {93721775-52EA-4193-83A5-3A541A335630}
      const ON_UUID line_pattern_id =
      { 0x93721775, 0x52ea, 0x4193, { 0x83, 0xa5, 0x3a, 0x54, 0x1a, 0x33, 0x56, 0x30 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Border",
        line_pattern
        );
      segments.Append(4.0);
      segments.Append(-1.0);
      segments.Append(4.0);
      segments.Append(-1.0);
      segments.Append(1.0);
      segments.Append(-1.0);
    }
    break;

  case -9: // Dots
    {
      // {E6A283A4-EBBE-4C25-A20C-B1135A791908}
      const ON_UUID line_pattern_id =
      { 0xe6a283a4, 0xebbe, 0x4c25, { 0xa2, 0xc, 0xb1, 0x13, 0x5a, 0x79, 0x19, 0x8 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Dots",
        line_pattern
        );
      segments.Append(0.0);
      segments.Append(-1.0);
    }
    break;

  default:
    ON_ERROR("Invalid index parameter");
    break;
  }

  if (segments.Count() > 0)
  {
    ON_LinetypeSegment segment;
    for( int i = 0; i < segments.Count(); i++)
    {
      segment.m_length = fabs(segments[i]);
      segment.m_seg_type = (segments[i] >=  0.0)
                         ? ON_LinetypeSegment::eSegType::stLine
                         : ON_LinetypeSegment::eSegType::stSpace;    
      line_pattern.AppendSegment(segment);
    }
  }
  line_pattern.LockPattern();

  return line_pattern;
}